

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

bool __thiscall cvm::BasicValue::toBool(BasicValue *this)

{
  bool bVar1;
  
  switch(this->Type) {
  case BoolType:
    return (this->field_2).BoolVal;
  case IntType:
    bVar1 = (this->field_2).IntVal == 0;
    break;
  case DoubleType:
    return (bool)(-((this->field_2).DoubleVal != 0.0) & 1);
  case StringType:
    bVar1 = (this->StrVal)._M_string_length == 0;
    break;
  default:
    return false;
  }
  return !bVar1;
}

Assistant:

bool BasicValue::toBool() const {
  switch (Type) {
  default:          return false;
  case IntType:     return IntVal != 0;
  case DoubleType:  return DoubleVal != 0.0;
  case BoolType:    return BoolVal;
  case StringType:  return !StrVal.empty();
  }
}